

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraction.cpp
# Opt level: O2

void Fraction::Test(void)

{
  __type _Var1;
  undefined4 extraout_EAX;
  undefined4 extraout_EAX_00;
  undefined4 extraout_EAX_01;
  undefined4 extraout_EAX_02;
  undefined4 extraout_EAX_03;
  undefined4 extraout_EAX_04;
  undefined4 extraout_EAX_05;
  undefined4 extraout_EAX_06;
  undefined4 extraout_EAX_07;
  undefined4 extraout_EAX_08;
  undefined4 extraout_EAX_09;
  undefined4 extraout_EAX_10;
  undefined4 extraout_EAX_11;
  undefined4 extraout_EAX_12;
  undefined4 extraout_EAX_13;
  undefined4 extraout_EAX_14;
  undefined4 extraout_EAX_15;
  undefined4 extraout_EAX_16;
  Fraction FVar2;
  int iVar3;
  bool bVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  int iVar23;
  string input;
  ostringstream out;
  int iStack_364;
  istringstream in;
  int iStack_1ec;
  Fraction f;
  string output;
  
  _in = 0;
  iStack_1ec = 1;
  Normalization((Fraction *)&in);
  if (1e-09 <= ABS((double)in._0_4_ / (double)in._4_4_)) {
    __assert_fail("fabs(Fraction(0, 1).ToDouble() - (double) 0) < eps",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Nicksechko[P]Math/fraction.cpp"
                  ,0xf6,"static void Fraction::Test()");
  }
  _in = 2;
  iStack_1ec = 3;
  Normalization((Fraction *)&in);
  if (1e-09 <= ABS((double)in._0_4_ / (double)in._4_4_ + -0.6666666666666666)) {
    __assert_fail("fabs(Fraction(2, 3).ToDouble() - (double) 2 / 3) < eps",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Nicksechko[P]Math/fraction.cpp"
                  ,0xf7,"static void Fraction::Test()");
  }
  _in = -7;
  iStack_1ec = 3;
  Normalization((Fraction *)&in);
  if (1e-09 <= ABS((double)in._0_4_ / (double)in._4_4_ + 2.3333333333333335)) {
    __assert_fail("fabs(Fraction(-7, 3).ToDouble() - (double) (-7) / 3) < eps",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Nicksechko[P]Math/fraction.cpp"
                  ,0xf8,"static void Fraction::Test()");
  }
  _in = 5;
  iStack_1ec = -9;
  Normalization((Fraction *)&in);
  if (1e-09 <= ABS((double)in._0_4_ / (double)in._4_4_ + 0.5555555555555556)) {
    __assert_fail("fabs(Fraction(5, -9).ToDouble() - (double) (-5) / 9) < eps",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Nicksechko[P]Math/fraction.cpp"
                  ,0xf9,"static void Fraction::Test()");
  }
  _in = -3;
  iStack_1ec = -0xb;
  Normalization((Fraction *)&in);
  if (1e-09 <= ABS((double)in._0_4_ / (double)in._4_4_ + -0.2727272727272727)) {
    __assert_fail("fabs(Fraction(-3, -11).ToDouble() - (double) 3 / 11) < eps",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Nicksechko[P]Math/fraction.cpp"
                  ,0xfa,"static void Fraction::Test()");
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&input,"6/3 0/6 4/6 -7/3 5/-9 -3/-11",(allocator<char> *)&in);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&output,"2 0 2/3 -7/3 -5/9 3/11 ",(allocator<char> *)&in);
  std::__cxx11::istringstream::istringstream((istringstream *)&in,(string *)&input,_S_in);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&out);
  iVar3 = 6;
  while (bVar4 = iVar3 != 0, iVar3 = iVar3 + -1, bVar4) {
    f.numerator_ = 0;
    f.denominator_ = 1;
    operator>>((istream *)&in,&f);
    operator<<((ostream *)&out,&f);
    std::operator<<((ostream *)&out," ");
  }
  std::__cxx11::stringbuf::str();
  _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&f,
                          &output);
  if (!_Var1) {
    __assert_fail("out.str() == output",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Nicksechko[P]Math/fraction.cpp"
                  ,0x109,"static void Fraction::Test()");
  }
  std::__cxx11::string::~string((string *)&f);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&out);
  std::__cxx11::istringstream::~istringstream((istringstream *)&in);
  std::__cxx11::string::~string((string *)&output);
  std::__cxx11::string::~string((string *)&input);
  _in = 0;
  iStack_1ec = 1;
  Normalization((Fraction *)&in);
  _out = 1;
  iStack_364 = 3;
  Normalization((Fraction *)&out);
  FVar2 = operator+((Fraction *)&in,(Fraction *)&out);
  input._M_dataplus._M_p = (pointer)0x300000001;
  Normalization((Fraction *)&input);
  if (((int)input._M_dataplus._M_p != FVar2.numerator_) ||
     (input._M_dataplus._M_p._4_4_ != FVar2.denominator_)) {
    __assert_fail("Fraction(0, 1) + Fraction(1, 3) == Fraction(1, 3)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Nicksechko[P]Math/fraction.cpp"
                  ,0x110,"static void Fraction::Test()");
  }
  _in = -5;
  iStack_1ec = 2;
  Normalization((Fraction *)&in);
  _out = 6;
  iStack_364 = 5;
  Normalization((Fraction *)&out);
  FVar2 = operator+((Fraction *)&in,(Fraction *)&out);
  input._M_dataplus._M_p = (pointer)0xafffffff3;
  Normalization((Fraction *)&input);
  if (((int)input._M_dataplus._M_p != FVar2.numerator_) ||
     (input._M_dataplus._M_p._4_4_ != FVar2.denominator_)) {
    __assert_fail("Fraction(-5, 2) + Fraction(6, 5) == Fraction(-13, 10)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Nicksechko[P]Math/fraction.cpp"
                  ,0x111,"static void Fraction::Test()");
  }
  _in = -5;
  iStack_1ec = 2;
  Normalization((Fraction *)&in);
  _out = 0;
  iStack_364 = 1;
  Normalization((Fraction *)&out);
  FVar2 = ::operator-((Fraction *)&in,(Fraction *)&out);
  input._M_dataplus._M_p = (pointer)0x2fffffffb;
  Normalization((Fraction *)&input);
  if (((int)input._M_dataplus._M_p != FVar2.numerator_) ||
     (input._M_dataplus._M_p._4_4_ != FVar2.denominator_)) {
    __assert_fail("Fraction(-5, 2) - Fraction(0, 1) == Fraction(-5, 2)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Nicksechko[P]Math/fraction.cpp"
                  ,0x112,"static void Fraction::Test()");
  }
  _in = 3;
  iStack_1ec = 7;
  Normalization((Fraction *)&in);
  _out = -6;
  iStack_364 = 0x19;
  Normalization((Fraction *)&out);
  FVar2 = ::operator-((Fraction *)&in,(Fraction *)&out);
  input._M_dataplus._M_p = (pointer)0xaf00000075;
  Normalization((Fraction *)&input);
  if (((int)input._M_dataplus._M_p != FVar2.numerator_) ||
     (input._M_dataplus._M_p._4_4_ != FVar2.denominator_)) {
    __assert_fail("Fraction(3, 7) - Fraction(-6, 25) == Fraction(117, 175)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Nicksechko[P]Math/fraction.cpp"
                  ,0x113,"static void Fraction::Test()");
  }
  _in = -5;
  iStack_1ec = 2;
  Normalization((Fraction *)&in);
  _out = 0;
  iStack_364 = 5;
  Normalization((Fraction *)&out);
  FVar2 = operator*((Fraction *)&in,(Fraction *)&out);
  input._M_dataplus._M_p = (pointer)0x100000000;
  Normalization((Fraction *)&input);
  if (((int)input._M_dataplus._M_p != FVar2.numerator_) ||
     (input._M_dataplus._M_p._4_4_ != FVar2.denominator_)) {
    __assert_fail("Fraction(-5, 2) * Fraction(0, 5) == Fraction(0, 1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Nicksechko[P]Math/fraction.cpp"
                  ,0x114,"static void Fraction::Test()");
  }
  _in = -5;
  iStack_1ec = 2;
  Normalization((Fraction *)&in);
  _out = -2;
  iStack_364 = 5;
  Normalization((Fraction *)&out);
  FVar2 = operator*((Fraction *)&in,(Fraction *)&out);
  input._M_dataplus._M_p = (pointer)0x100000001;
  Normalization((Fraction *)&input);
  if (((int)input._M_dataplus._M_p != FVar2.numerator_) ||
     (input._M_dataplus._M_p._4_4_ != FVar2.denominator_)) {
    __assert_fail("Fraction(-5, 2) * Fraction(-2, 5) == Fraction(1, 1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Nicksechko[P]Math/fraction.cpp"
                  ,0x115,"static void Fraction::Test()");
  }
  _in = 0;
  iStack_1ec = 1;
  Normalization((Fraction *)&in);
  _out = 2;
  iStack_364 = 5;
  Normalization((Fraction *)&out);
  FVar2 = operator/((Fraction *)&in,(Fraction *)&out);
  input._M_dataplus._M_p = (pointer)0x100000000;
  Normalization((Fraction *)&input);
  if (((int)input._M_dataplus._M_p != FVar2.numerator_) ||
     (input._M_dataplus._M_p._4_4_ != FVar2.denominator_)) {
    __assert_fail("Fraction(0, 1) / Fraction(2, 5) == Fraction(0, 1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Nicksechko[P]Math/fraction.cpp"
                  ,0x116,"static void Fraction::Test()");
  }
  _in = -5;
  iStack_1ec = 2;
  Normalization((Fraction *)&in);
  _out = 2;
  iStack_364 = 5;
  Normalization((Fraction *)&out);
  FVar2 = operator/((Fraction *)&in,(Fraction *)&out);
  input._M_dataplus._M_p = (pointer)0x4ffffffe7;
  Normalization((Fraction *)&input);
  if (((int)input._M_dataplus._M_p != FVar2.numerator_) ||
     (input._M_dataplus._M_p._4_4_ != FVar2.denominator_)) {
    __assert_fail("Fraction(-5, 2) / Fraction(2, 5) == Fraction(-25, 4)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Nicksechko[P]Math/fraction.cpp"
                  ,0x117,"static void Fraction::Test()");
  }
  _in = 1;
  iStack_1ec = 3;
  Normalization((Fraction *)&in);
  _out = 1;
  iStack_364 = 3;
  Normalization((Fraction *)&out);
  iVar3 = -(uint)(out._0_4_ == in._0_4_);
  iVar23 = -(uint)(out._4_4_ == in._4_4_);
  auVar5._4_4_ = iVar3;
  auVar5._0_4_ = iVar3;
  auVar5._8_4_ = iVar23;
  auVar5._12_4_ = iVar23;
  iVar3 = movmskpd(extraout_EAX,auVar5);
  if (iVar3 != 3) {
    __assert_fail("Fraction(1, 3) == Fraction(1, 3)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Nicksechko[P]Math/fraction.cpp"
                  ,0x11a,"static void Fraction::Test()");
  }
  _in = 4;
  iStack_1ec = 2;
  Normalization((Fraction *)&in);
  _out = 2;
  iStack_364 = 1;
  Normalization((Fraction *)&out);
  iVar3 = -(uint)(out._0_4_ == in._0_4_);
  iVar23 = -(uint)(out._4_4_ == in._4_4_);
  auVar6._4_4_ = iVar3;
  auVar6._0_4_ = iVar3;
  auVar6._8_4_ = iVar23;
  auVar6._12_4_ = iVar23;
  iVar3 = movmskpd(extraout_EAX_00,auVar6);
  if (iVar3 != 3) {
    __assert_fail("Fraction(4, 2) == Fraction(2, 1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Nicksechko[P]Math/fraction.cpp"
                  ,0x11b,"static void Fraction::Test()");
  }
  _in = -5;
  iStack_1ec = 2;
  Normalization((Fraction *)&in);
  _out = 6;
  iStack_364 = 5;
  Normalization((Fraction *)&out);
  if ((_in == _out) && (iStack_1ec == iStack_364)) {
    __assert_fail("Fraction(-5, 2) != Fraction(6, 5)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Nicksechko[P]Math/fraction.cpp"
                  ,0x11c,"static void Fraction::Test()");
  }
  _in = 5;
  iStack_1ec = 2;
  Normalization((Fraction *)&in);
  _out = 0xb;
  iStack_364 = 4;
  Normalization((Fraction *)&out);
  if ((_in == _out) && (iStack_1ec == iStack_364)) {
    __assert_fail("Fraction(5, 2) != Fraction(11, 4)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Nicksechko[P]Math/fraction.cpp"
                  ,0x11d,"static void Fraction::Test()");
  }
  _in = -5;
  iStack_1ec = 2;
  Normalization((Fraction *)&in);
  _out = 0;
  iStack_364 = 1;
  Normalization((Fraction *)&out);
  if (_out * iStack_1ec <= iStack_364 * _in) {
    __assert_fail("Fraction(-5, 2) < Fraction(0, 1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Nicksechko[P]Math/fraction.cpp"
                  ,0x11e,"static void Fraction::Test()");
  }
  _in = 3;
  iStack_1ec = 5;
  Normalization((Fraction *)&in);
  _out = 2;
  iStack_364 = 3;
  Normalization((Fraction *)&out);
  if (_out * iStack_1ec <= iStack_364 * _in) {
    __assert_fail("Fraction(3, 5) < Fraction(2, 3)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Nicksechko[P]Math/fraction.cpp"
                  ,0x11f,"static void Fraction::Test()");
  }
  _in = 3;
  iStack_1ec = 7;
  Normalization((Fraction *)&in);
  _out = -6;
  iStack_364 = 0x19;
  Normalization((Fraction *)&out);
  if (iStack_364 * _in <= _out * iStack_1ec) {
    __assert_fail("Fraction(3, 7) > Fraction(-6, 25)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Nicksechko[P]Math/fraction.cpp"
                  ,0x120,"static void Fraction::Test()");
  }
  _in = 5;
  iStack_1ec = 2;
  Normalization((Fraction *)&in);
  _out = 0;
  iStack_364 = 1;
  Normalization((Fraction *)&out);
  if (iStack_364 * _in <= _out * iStack_1ec) {
    __assert_fail("Fraction(5, 2) > Fraction(0, 1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Nicksechko[P]Math/fraction.cpp"
                  ,0x121,"static void Fraction::Test()");
  }
  _in = -1;
  iStack_1ec = 2;
  Normalization((Fraction *)&in);
  _out = 0;
  iStack_364 = 1;
  Normalization((Fraction *)&out);
  if (_out * iStack_1ec < iStack_364 * _in) {
    __assert_fail("Fraction(-1, 2) <= Fraction(0, 1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Nicksechko[P]Math/fraction.cpp"
                  ,0x122,"static void Fraction::Test()");
  }
  _in = -1;
  iStack_1ec = 2;
  Normalization((Fraction *)&in);
  _out = -4;
  iStack_364 = 8;
  Normalization((Fraction *)&out);
  if (_out * iStack_1ec < iStack_364 * _in) {
    __assert_fail("Fraction(-1, 2) <= Fraction(-4, 8)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Nicksechko[P]Math/fraction.cpp"
                  ,0x123,"static void Fraction::Test()");
  }
  _in = -2;
  iStack_1ec = 5;
  Normalization((Fraction *)&in);
  _out = -5;
  iStack_364 = 2;
  Normalization((Fraction *)&out);
  if (iStack_364 * _in < _out * iStack_1ec) {
    __assert_fail("Fraction(-2, 5) >= Fraction(-5, 2)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Nicksechko[P]Math/fraction.cpp"
                  ,0x124,"static void Fraction::Test()");
  }
  _in = -10;
  iStack_1ec = 4;
  Normalization((Fraction *)&in);
  _out = -5;
  iStack_364 = 2;
  Normalization((Fraction *)&out);
  if (iStack_364 * _in < _out * iStack_1ec) {
    __assert_fail("Fraction(-10, 4) >= Fraction(-5, 2)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Nicksechko[P]Math/fraction.cpp"
                  ,0x125,"static void Fraction::Test()");
  }
  _in = 0;
  iStack_1ec = 1;
  Normalization((Fraction *)&in);
  input._M_dataplus._M_p._0_4_ = 1;
  FVar2 = operator+((Fraction *)&in,(int *)&input);
  _out = 1;
  iStack_364 = 1;
  Normalization((Fraction *)&out);
  if ((_out != FVar2.numerator_) || (iStack_364 != FVar2.denominator_)) {
    __assert_fail("Fraction(0, 1) + 1 == Fraction(1, 1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Nicksechko[P]Math/fraction.cpp"
                  ,0x128,"static void Fraction::Test()");
  }
  _in = -5;
  iStack_1ec = 2;
  Normalization((Fraction *)&in);
  input._M_dataplus._M_p._0_4_ = 5;
  FVar2 = operator+((Fraction *)&in,(int *)&input);
  _out = 5;
  iStack_364 = 2;
  Normalization((Fraction *)&out);
  if ((_out != FVar2.numerator_) || (iStack_364 != FVar2.denominator_)) {
    __assert_fail("Fraction(-5, 2) + 5 == Fraction(5, 2)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Nicksechko[P]Math/fraction.cpp"
                  ,0x129,"static void Fraction::Test()");
  }
  _in = -5;
  iStack_1ec = 2;
  Normalization((Fraction *)&in);
  input._M_dataplus._M_p = input._M_dataplus._M_p & 0xffffffff00000000;
  FVar2 = ::operator-((Fraction *)&in,(int *)&input);
  _out = -5;
  iStack_364 = 2;
  Normalization((Fraction *)&out);
  if ((_out != FVar2.numerator_) || (iStack_364 != FVar2.denominator_)) {
    __assert_fail("Fraction(-5, 2) - 0 == Fraction(-5, 2)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Nicksechko[P]Math/fraction.cpp"
                  ,0x12a,"static void Fraction::Test()");
  }
  _in = 3;
  iStack_1ec = 7;
  Normalization((Fraction *)&in);
  input._M_dataplus._M_p._0_4_ = 0x19;
  FVar2 = ::operator-((Fraction *)&in,(int *)&input);
  _out = -0xac;
  iStack_364 = 7;
  Normalization((Fraction *)&out);
  if ((_out != FVar2.numerator_) || (iStack_364 != FVar2.denominator_)) {
    __assert_fail("Fraction(3, 7) - 25 == Fraction(-172, 7)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Nicksechko[P]Math/fraction.cpp"
                  ,299,"static void Fraction::Test()");
  }
  _in = -5;
  iStack_1ec = 2;
  Normalization((Fraction *)&in);
  input._M_dataplus._M_p = input._M_dataplus._M_p & 0xffffffff00000000;
  FVar2 = operator*((Fraction *)&in,(int *)&input);
  _out = 0;
  iStack_364 = 1;
  Normalization((Fraction *)&out);
  if ((_out != FVar2.numerator_) || (iStack_364 != FVar2.denominator_)) {
    __assert_fail("Fraction(-5, 2) * 0 == Fraction(0, 1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Nicksechko[P]Math/fraction.cpp"
                  ,300,"static void Fraction::Test()");
  }
  _in = -5;
  iStack_1ec = 2;
  Normalization((Fraction *)&in);
  input._M_dataplus._M_p._0_4_ = 0xfffffffe;
  FVar2 = operator*((Fraction *)&in,(int *)&input);
  _out = 5;
  iStack_364 = 1;
  Normalization((Fraction *)&out);
  if ((_out != FVar2.numerator_) || (iStack_364 != FVar2.denominator_)) {
    __assert_fail("Fraction(-5, 2) * (-2) == Fraction(5, 1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Nicksechko[P]Math/fraction.cpp"
                  ,0x12d,"static void Fraction::Test()");
  }
  _in = 0;
  iStack_1ec = 1;
  Normalization((Fraction *)&in);
  input._M_dataplus._M_p._0_4_ = 5;
  FVar2 = operator/((Fraction *)&in,(int *)&input);
  _out = 0;
  iStack_364 = 1;
  Normalization((Fraction *)&out);
  if ((_out != FVar2.numerator_) || (iStack_364 != FVar2.denominator_)) {
    __assert_fail("Fraction(0, 1) / 5 == Fraction(0, 1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Nicksechko[P]Math/fraction.cpp"
                  ,0x12e,"static void Fraction::Test()");
  }
  _in = -5;
  iStack_1ec = 2;
  Normalization((Fraction *)&in);
  input._M_dataplus._M_p._0_4_ = 2;
  FVar2 = operator/((Fraction *)&in,(int *)&input);
  _out = -5;
  iStack_364 = 4;
  Normalization((Fraction *)&out);
  if ((_out == FVar2.numerator_) && (iStack_364 == FVar2.denominator_)) {
    input._M_dataplus._M_p._0_4_ = 3;
    _in = 0;
    iStack_1ec = 1;
    Normalization((Fraction *)&in);
    FVar2 = operator+((int *)&input,(Fraction *)&in);
    _out = 3;
    iStack_364 = 1;
    Normalization((Fraction *)&out);
    if ((_out != FVar2.numerator_) || (iStack_364 != FVar2.denominator_)) {
      __assert_fail("3 + Fraction(0, 1) == Fraction(3, 1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Nicksechko[P]Math/fraction.cpp"
                    ,0x132,"static void Fraction::Test()");
    }
    input._M_dataplus._M_p._0_4_ = 6;
    _in = -5;
    iStack_1ec = 2;
    Normalization((Fraction *)&in);
    FVar2 = operator+((int *)&input,(Fraction *)&in);
    _out = 7;
    iStack_364 = 2;
    Normalization((Fraction *)&out);
    if ((_out != FVar2.numerator_) || (iStack_364 != FVar2.denominator_)) {
      __assert_fail("6 + Fraction(-5, 2) == Fraction(7, 2)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Nicksechko[P]Math/fraction.cpp"
                    ,0x133,"static void Fraction::Test()");
    }
    input._M_dataplus._M_p._0_4_ = 1;
    _in = -5;
    iStack_1ec = 2;
    Normalization((Fraction *)&in);
    FVar2 = ::operator-((int *)&input,(Fraction *)&in);
    _out = 7;
    iStack_364 = 2;
    Normalization((Fraction *)&out);
    if ((_out != FVar2.numerator_) || (iStack_364 != FVar2.denominator_)) {
      __assert_fail("1 - Fraction(-5, 2) == Fraction(7, 2)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Nicksechko[P]Math/fraction.cpp"
                    ,0x134,"static void Fraction::Test()");
    }
    input._M_dataplus._M_p._0_4_ = 0x19;
    _in = 3;
    iStack_1ec = 7;
    Normalization((Fraction *)&in);
    FVar2 = ::operator-((int *)&input,(Fraction *)&in);
    _out = 0xac;
    iStack_364 = 7;
    Normalization((Fraction *)&out);
    if ((_out != FVar2.numerator_) || (iStack_364 != FVar2.denominator_)) {
      __assert_fail("25 - Fraction(3, 7) == Fraction(172, 7)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Nicksechko[P]Math/fraction.cpp"
                    ,0x135,"static void Fraction::Test()");
    }
    input._M_dataplus._M_p._0_4_ = 5;
    _in = -5;
    iStack_1ec = 2;
    Normalization((Fraction *)&in);
    FVar2 = operator*((int *)&input,(Fraction *)&in);
    _out = -0x19;
    iStack_364 = 2;
    Normalization((Fraction *)&out);
    if ((_out != FVar2.numerator_) || (iStack_364 != FVar2.denominator_)) {
      __assert_fail("5 * Fraction(-5, 2) == Fraction(-25, 2)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Nicksechko[P]Math/fraction.cpp"
                    ,0x136,"static void Fraction::Test()");
    }
    input._M_dataplus._M_p._0_4_ = 0xfffffffb;
    _in = -5;
    iStack_1ec = 2;
    Normalization((Fraction *)&in);
    FVar2 = operator*((int *)&input,(Fraction *)&in);
    _out = 0x19;
    iStack_364 = 2;
    Normalization((Fraction *)&out);
    if ((_out != FVar2.numerator_) || (iStack_364 != FVar2.denominator_)) {
      __assert_fail("(-5) * Fraction(-5, 2) == Fraction(25, 2)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Nicksechko[P]Math/fraction.cpp"
                    ,0x137,"static void Fraction::Test()");
    }
    input._M_dataplus._M_p._0_4_ = 2;
    _in = 1;
    iStack_1ec = 1;
    Normalization((Fraction *)&in);
    FVar2 = operator/((int *)&input,(Fraction *)&in);
    _out = 2;
    iStack_364 = 1;
    Normalization((Fraction *)&out);
    if ((_out != FVar2.numerator_) || (iStack_364 != FVar2.denominator_)) {
      __assert_fail("2 / Fraction(1, 1) == Fraction(2, 1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Nicksechko[P]Math/fraction.cpp"
                    ,0x138,"static void Fraction::Test()");
    }
    input._M_dataplus._M_p._0_4_ = 2;
    _in = -5;
    iStack_1ec = 2;
    Normalization((Fraction *)&in);
    FVar2 = operator/((int *)&input,(Fraction *)&in);
    _out = -4;
    iStack_364 = 5;
    Normalization((Fraction *)&out);
    if ((_out != FVar2.numerator_) || (iStack_364 != FVar2.denominator_)) {
      __assert_fail("2 / Fraction(-5, 2) == Fraction(-4, 5)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Nicksechko[P]Math/fraction.cpp"
                    ,0x139,"static void Fraction::Test()");
    }
    _in = 0;
    iStack_1ec = 1;
    _out = 0;
    iStack_364 = 1;
    Normalization((Fraction *)&out);
    _in = _out;
    _out = 1;
    iStack_364 = 3;
    Normalization((Fraction *)&out);
    operator+=((Fraction *)&in,(Fraction *)&out);
    _out = 1;
    iStack_364 = 3;
    Normalization((Fraction *)&out);
    iVar3 = -(uint)(out._0_4_ == in._0_4_);
    iVar23 = -(uint)(out._4_4_ == in._4_4_);
    auVar7._4_4_ = iVar3;
    auVar7._0_4_ = iVar3;
    auVar7._8_4_ = iVar23;
    auVar7._12_4_ = iVar23;
    iVar3 = movmskpd(extraout_EAX_01,auVar7);
    if (iVar3 != 3) {
      __assert_fail("a == Fraction(1, 3)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Nicksechko[P]Math/fraction.cpp"
                    ,0x13f,"static void Fraction::Test()");
    }
    _out = -5;
    iStack_364 = 2;
    Normalization((Fraction *)&out);
    _in = _out;
    _out = 6;
    iStack_364 = 5;
    Normalization((Fraction *)&out);
    operator+=((Fraction *)&in,(Fraction *)&out);
    _out = -0xd;
    iStack_364 = 10;
    Normalization((Fraction *)&out);
    iVar3 = -(uint)(out._0_4_ == in._0_4_);
    iVar23 = -(uint)(out._4_4_ == in._4_4_);
    auVar8._4_4_ = iVar3;
    auVar8._0_4_ = iVar3;
    auVar8._8_4_ = iVar23;
    auVar8._12_4_ = iVar23;
    iVar3 = movmskpd(extraout_EAX_02,auVar8);
    if (iVar3 != 3) {
      __assert_fail("a == Fraction(-13, 10)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Nicksechko[P]Math/fraction.cpp"
                    ,0x143,"static void Fraction::Test()");
    }
    _out = -5;
    iStack_364 = 2;
    Normalization((Fraction *)&out);
    _in = _out;
    _out = 0;
    iStack_364 = 1;
    Normalization((Fraction *)&out);
    operator-=((Fraction *)&in,(Fraction *)&out);
    _out = -5;
    iStack_364 = 2;
    Normalization((Fraction *)&out);
    iVar3 = -(uint)(out._0_4_ == in._0_4_);
    iVar23 = -(uint)(out._4_4_ == in._4_4_);
    auVar9._4_4_ = iVar3;
    auVar9._0_4_ = iVar3;
    auVar9._8_4_ = iVar23;
    auVar9._12_4_ = iVar23;
    iVar3 = movmskpd(extraout_EAX_03,auVar9);
    if (iVar3 != 3) {
      __assert_fail("a == Fraction(-5, 2)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Nicksechko[P]Math/fraction.cpp"
                    ,0x147,"static void Fraction::Test()");
    }
    _out = 3;
    iStack_364 = 7;
    Normalization((Fraction *)&out);
    _in = _out;
    _out = -6;
    iStack_364 = 0x19;
    Normalization((Fraction *)&out);
    operator-=((Fraction *)&in,(Fraction *)&out);
    _out = 0x75;
    iStack_364 = 0xaf;
    Normalization((Fraction *)&out);
    iVar3 = -(uint)(out._0_4_ == in._0_4_);
    iVar23 = -(uint)(out._4_4_ == in._4_4_);
    auVar10._4_4_ = iVar3;
    auVar10._0_4_ = iVar3;
    auVar10._8_4_ = iVar23;
    auVar10._12_4_ = iVar23;
    iVar3 = movmskpd(extraout_EAX_04,auVar10);
    if (iVar3 != 3) {
      __assert_fail("a == Fraction(117, 175)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Nicksechko[P]Math/fraction.cpp"
                    ,0x14b,"static void Fraction::Test()");
    }
    _out = -5;
    iStack_364 = 2;
    Normalization((Fraction *)&out);
    _in = _out;
    _out = 0;
    iStack_364 = 5;
    Normalization((Fraction *)&out);
    operator*=((Fraction *)&in,(Fraction *)&out);
    _out = 0;
    iStack_364 = 1;
    Normalization((Fraction *)&out);
    iVar3 = -(uint)(out._0_4_ == in._0_4_);
    iVar23 = -(uint)(out._4_4_ == in._4_4_);
    auVar11._4_4_ = iVar3;
    auVar11._0_4_ = iVar3;
    auVar11._8_4_ = iVar23;
    auVar11._12_4_ = iVar23;
    iVar3 = movmskpd(extraout_EAX_05,auVar11);
    if (iVar3 != 3) {
      __assert_fail("a == Fraction(0, 1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Nicksechko[P]Math/fraction.cpp"
                    ,0x14f,"static void Fraction::Test()");
    }
    _out = -5;
    iStack_364 = 2;
    Normalization((Fraction *)&out);
    _in = _out;
    _out = -2;
    iStack_364 = 5;
    Normalization((Fraction *)&out);
    operator*=((Fraction *)&in,(Fraction *)&out);
    _out = 1;
    iStack_364 = 1;
    Normalization((Fraction *)&out);
    iVar3 = -(uint)(out._0_4_ == in._0_4_);
    iVar23 = -(uint)(out._4_4_ == in._4_4_);
    auVar12._4_4_ = iVar3;
    auVar12._0_4_ = iVar3;
    auVar12._8_4_ = iVar23;
    auVar12._12_4_ = iVar23;
    iVar3 = movmskpd(extraout_EAX_06,auVar12);
    if (iVar3 != 3) {
      __assert_fail("a == Fraction(1, 1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Nicksechko[P]Math/fraction.cpp"
                    ,0x153,"static void Fraction::Test()");
    }
    _out = 0;
    iStack_364 = 1;
    Normalization((Fraction *)&out);
    _in = _out;
    _out = 2;
    iStack_364 = 5;
    Normalization((Fraction *)&out);
    operator/=((Fraction *)&in,(Fraction *)&out);
    _out = 0;
    iStack_364 = 1;
    Normalization((Fraction *)&out);
    iVar3 = -(uint)(out._0_4_ == in._0_4_);
    iVar23 = -(uint)(out._4_4_ == in._4_4_);
    auVar13._4_4_ = iVar3;
    auVar13._0_4_ = iVar3;
    auVar13._8_4_ = iVar23;
    auVar13._12_4_ = iVar23;
    iVar3 = movmskpd(extraout_EAX_07,auVar13);
    if (iVar3 != 3) {
      __assert_fail("a == Fraction(0, 1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Nicksechko[P]Math/fraction.cpp"
                    ,0x157,"static void Fraction::Test()");
    }
    _out = -5;
    iStack_364 = 2;
    Normalization((Fraction *)&out);
    _in = _out;
    _out = 2;
    iStack_364 = 5;
    Normalization((Fraction *)&out);
    operator/=((Fraction *)&in,(Fraction *)&out);
    _out = -0x19;
    iStack_364 = 4;
    Normalization((Fraction *)&out);
    iVar3 = -(uint)(out._0_4_ == in._0_4_);
    iVar23 = -(uint)(out._4_4_ == in._4_4_);
    auVar14._4_4_ = iVar3;
    auVar14._0_4_ = iVar3;
    auVar14._8_4_ = iVar23;
    auVar14._12_4_ = iVar23;
    iVar3 = movmskpd(extraout_EAX_08,auVar14);
    if (iVar3 != 3) {
      __assert_fail("a == Fraction(-25, 4)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Nicksechko[P]Math/fraction.cpp"
                    ,0x15b,"static void Fraction::Test()");
    }
    _in = 0;
    iStack_1ec = 1;
    Normalization((Fraction *)&in);
    _out = 1;
    operator+=((Fraction *)&in,(int *)&out);
    _out = 1;
    iStack_364 = 1;
    Normalization((Fraction *)&out);
    iVar3 = -(uint)(out._0_4_ == in._0_4_);
    iVar23 = -(uint)(out._4_4_ == in._4_4_);
    auVar15._4_4_ = iVar3;
    auVar15._0_4_ = iVar3;
    auVar15._8_4_ = iVar23;
    auVar15._12_4_ = iVar23;
    iVar3 = movmskpd(extraout_EAX_09,auVar15);
    if (iVar3 != 3) {
      __assert_fail("a == Fraction(1, 1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Nicksechko[P]Math/fraction.cpp"
                    ,0x161,"static void Fraction::Test()");
    }
    _out = -5;
    iStack_364 = 2;
    Normalization((Fraction *)&out);
    _in = _out;
    _out = 5;
    operator+=((Fraction *)&in,(int *)&out);
    _out = 5;
    iStack_364 = 2;
    Normalization((Fraction *)&out);
    iVar3 = -(uint)(out._0_4_ == in._0_4_);
    iVar23 = -(uint)(out._4_4_ == in._4_4_);
    auVar16._4_4_ = iVar3;
    auVar16._0_4_ = iVar3;
    auVar16._8_4_ = iVar23;
    auVar16._12_4_ = iVar23;
    iVar3 = movmskpd(extraout_EAX_10,auVar16);
    if (iVar3 != 3) {
      __assert_fail("a == Fraction(5, 2)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Nicksechko[P]Math/fraction.cpp"
                    ,0x165,"static void Fraction::Test()");
    }
    _out = -5;
    iStack_364 = 2;
    Normalization((Fraction *)&out);
    _in = _out;
    _out = (Fraction)((ulong)_out & 0xffffffff00000000);
    operator-=((Fraction *)&in,(int *)&out);
    _out = -5;
    iStack_364 = 2;
    Normalization((Fraction *)&out);
    iVar3 = -(uint)(out._0_4_ == in._0_4_);
    iVar23 = -(uint)(out._4_4_ == in._4_4_);
    auVar17._4_4_ = iVar3;
    auVar17._0_4_ = iVar3;
    auVar17._8_4_ = iVar23;
    auVar17._12_4_ = iVar23;
    iVar3 = movmskpd(extraout_EAX_11,auVar17);
    if (iVar3 != 3) {
      __assert_fail("a == Fraction(-5, 2)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Nicksechko[P]Math/fraction.cpp"
                    ,0x169,"static void Fraction::Test()");
    }
    _out = 3;
    iStack_364 = 7;
    Normalization((Fraction *)&out);
    _in = _out;
    _out = 0x19;
    operator-=((Fraction *)&in,(int *)&out);
    _out = -0xac;
    iStack_364 = 7;
    Normalization((Fraction *)&out);
    iVar3 = -(uint)(out._0_4_ == in._0_4_);
    iVar23 = -(uint)(out._4_4_ == in._4_4_);
    auVar18._4_4_ = iVar3;
    auVar18._0_4_ = iVar3;
    auVar18._8_4_ = iVar23;
    auVar18._12_4_ = iVar23;
    iVar3 = movmskpd(extraout_EAX_12,auVar18);
    if (iVar3 != 3) {
      __assert_fail("a == Fraction(-172, 7)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Nicksechko[P]Math/fraction.cpp"
                    ,0x16d,"static void Fraction::Test()");
    }
    _out = -5;
    iStack_364 = 2;
    Normalization((Fraction *)&out);
    _in = _out;
    _out = (Fraction)((ulong)_out & 0xffffffff00000000);
    operator*=((Fraction *)&in,(int *)&out);
    _out = 0;
    iStack_364 = 1;
    Normalization((Fraction *)&out);
    iVar3 = -(uint)(out._0_4_ == in._0_4_);
    iVar23 = -(uint)(out._4_4_ == in._4_4_);
    auVar19._4_4_ = iVar3;
    auVar19._0_4_ = iVar3;
    auVar19._8_4_ = iVar23;
    auVar19._12_4_ = iVar23;
    iVar3 = movmskpd(extraout_EAX_13,auVar19);
    if (iVar3 != 3) {
      __assert_fail("a == Fraction(0, 1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Nicksechko[P]Math/fraction.cpp"
                    ,0x171,"static void Fraction::Test()");
    }
    _out = -5;
    iStack_364 = 2;
    Normalization((Fraction *)&out);
    _in = _out;
    _out = -2;
    operator*=((Fraction *)&in,(int *)&out);
    _out = 5;
    iStack_364 = 1;
    Normalization((Fraction *)&out);
    iVar3 = -(uint)(out._0_4_ == in._0_4_);
    iVar23 = -(uint)(out._4_4_ == in._4_4_);
    auVar20._4_4_ = iVar3;
    auVar20._0_4_ = iVar3;
    auVar20._8_4_ = iVar23;
    auVar20._12_4_ = iVar23;
    iVar3 = movmskpd(extraout_EAX_14,auVar20);
    if (iVar3 != 3) {
      __assert_fail("a == Fraction(5, 1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Nicksechko[P]Math/fraction.cpp"
                    ,0x175,"static void Fraction::Test()");
    }
    _out = 0;
    iStack_364 = 1;
    Normalization((Fraction *)&out);
    _in = _out;
    _out = 5;
    operator/=((Fraction *)&in,(int *)&out);
    _out = 0;
    iStack_364 = 1;
    Normalization((Fraction *)&out);
    iVar3 = -(uint)(out._0_4_ == in._0_4_);
    iVar23 = -(uint)(out._4_4_ == in._4_4_);
    auVar21._4_4_ = iVar3;
    auVar21._0_4_ = iVar3;
    auVar21._8_4_ = iVar23;
    auVar21._12_4_ = iVar23;
    iVar3 = movmskpd(extraout_EAX_15,auVar21);
    if (iVar3 != 3) {
      __assert_fail("a == Fraction(0, 1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Nicksechko[P]Math/fraction.cpp"
                    ,0x179,"static void Fraction::Test()");
    }
    _out = -5;
    iStack_364 = 2;
    Normalization((Fraction *)&out);
    _in = _out;
    _out = 2;
    operator/=((Fraction *)&in,(int *)&out);
    _out = -5;
    iStack_364 = 4;
    Normalization((Fraction *)&out);
    iVar3 = -(uint)(out._0_4_ == in._0_4_);
    iVar23 = -(uint)(out._4_4_ == in._4_4_);
    auVar22._4_4_ = iVar3;
    auVar22._0_4_ = iVar3;
    auVar22._8_4_ = iVar23;
    auVar22._12_4_ = iVar23;
    iVar3 = movmskpd(extraout_EAX_16,auVar22);
    if (iVar3 == 3) {
      return;
    }
    __assert_fail("a == Fraction(-5, 4)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Nicksechko[P]Math/fraction.cpp"
                  ,0x17d,"static void Fraction::Test()");
  }
  __assert_fail("Fraction(-5, 2) / 2 == Fraction(-5, 4)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Nicksechko[P]Math/fraction.cpp"
                ,0x12f,"static void Fraction::Test()");
}

Assistant:

void Fraction::Test() {
  {//Test Case 1
    const double eps = 1e-9;
    assert(fabs(Fraction(0, 1).ToDouble() - (double) 0) < eps);
    assert(fabs(Fraction(2, 3).ToDouble() - (double) 2 / 3) < eps);
    assert(fabs(Fraction(-7, 3).ToDouble() - (double) (-7) / 3) < eps);
    assert(fabs(Fraction(5, -9).ToDouble() - (double) (-5) / 9) < eps);
    assert(fabs(Fraction(-3, -11).ToDouble() - (double) 3 / 11) < eps);
  }
  {//Test Case 2
    int n = 6;
    std::string input = "6/3 0/6 4/6 -7/3 5/-9 -3/-11";
    std::string output = "2 0 2/3 -7/3 -5/9 3/11 ";

    std::istringstream in(input);
    std::ostringstream out;
    for (int i = 0; i < n; i++) {
      Fraction f;
      in >> f;
      out << f << " ";
    }

    assert(out.str() == output);
  }
  //Test Case 3
  {
    //TODO
  }
  {//Test Case 4
    assert(Fraction(0, 1) + Fraction(1, 3) == Fraction(1, 3));
    assert(Fraction(-5, 2) + Fraction(6, 5) == Fraction(-13, 10));
    assert(Fraction(-5, 2) - Fraction(0, 1) == Fraction(-5, 2));
    assert(Fraction(3, 7) - Fraction(-6, 25) == Fraction(117, 175));
    assert(Fraction(-5, 2) * Fraction(0, 5) == Fraction(0, 1));
    assert(Fraction(-5, 2) * Fraction(-2, 5) == Fraction(1, 1));
    assert(Fraction(0, 1) / Fraction(2, 5) == Fraction(0, 1));
    assert(Fraction(-5, 2) / Fraction(2, 5) == Fraction(-25, 4));
  }
  {//Test Case 5
    assert(Fraction(1, 3) == Fraction(1, 3));
    assert(Fraction(4, 2) == Fraction(2, 1));
    assert(Fraction(-5, 2) != Fraction(6, 5));
    assert(Fraction(5, 2) != Fraction(11, 4));
    assert(Fraction(-5, 2) < Fraction(0, 1));
    assert(Fraction(3, 5) < Fraction(2, 3));
    assert(Fraction(3, 7) > Fraction(-6, 25));
    assert(Fraction(5, 2) > Fraction(0, 1));
    assert(Fraction(-1, 2) <= Fraction(0, 1));
    assert(Fraction(-1, 2) <= Fraction(-4, 8));
    assert(Fraction(-2, 5) >= Fraction(-5, 2));
    assert(Fraction(-10, 4) >= Fraction(-5, 2));
  }
  {//Test Case 6
    assert(Fraction(0, 1) + 1 == Fraction(1, 1));
    assert(Fraction(-5, 2) + 5 == Fraction(5, 2));
    assert(Fraction(-5, 2) - 0 == Fraction(-5, 2));
    assert(Fraction(3, 7) - 25 == Fraction(-172, 7));
    assert(Fraction(-5, 2) * 0 == Fraction(0, 1));
    assert(Fraction(-5, 2) * (-2) == Fraction(5, 1));
    assert(Fraction(0, 1) / 5 == Fraction(0, 1));
    assert(Fraction(-5, 2) / 2 == Fraction(-5, 4));
  }
  {//Test Case 7
    assert(3 + Fraction(0, 1) == Fraction(3, 1));
    assert(6 + Fraction(-5, 2) == Fraction(7, 2));
    assert(1 - Fraction(-5, 2) == Fraction(7, 2));
    assert(25 - Fraction(3, 7) == Fraction(172, 7));
    assert(5 * Fraction(-5, 2) == Fraction(-25, 2));
    assert((-5) * Fraction(-5, 2) == Fraction(25, 2));
    assert(2 / Fraction(1, 1) == Fraction(2, 1));
    assert(2 / Fraction(-5, 2) == Fraction(-4, 5));
  }
  {//Test Case 8
    Fraction a;
    a = Fraction(0, 1);
    a += Fraction(1, 3);
    assert(a == Fraction(1, 3));

    a = Fraction(-5, 2);
    a += Fraction(6, 5);
    assert(a == Fraction(-13, 10));

    a = Fraction(-5, 2);
    a -= Fraction(0, 1);
    assert(a == Fraction(-5, 2));

    a = Fraction(3, 7);
    a -= Fraction(-6, 25);
    assert(a == Fraction(117, 175));

    a = Fraction(-5, 2);
    a *= Fraction(0, 5);
    assert(a == Fraction(0, 1));

    a = Fraction(-5, 2);
    a *= Fraction(-2, 5);
    assert(a == Fraction(1, 1));

    a = Fraction(0, 1);
    a /= Fraction(2, 5);
    assert(a == Fraction(0, 1));

    a = Fraction(-5, 2);
    a /= Fraction(2, 5);
    assert(a == Fraction(-25, 4));
  }

  {//Test Case 9
    Fraction a = Fraction(0, 1);
    a += 1;
    assert(a == Fraction(1, 1));

    a = Fraction(-5, 2);
    a += 5;
    assert(a == Fraction(5, 2));

    a = Fraction(-5, 2);
    a -= 0;
    assert(a == Fraction(-5, 2));

    a = Fraction(3, 7);
    a -= 25;
    assert(a == Fraction(-172, 7));

    a = Fraction(-5, 2);
    a *= 0;
    assert(a == Fraction(0, 1));

    a = Fraction(-5, 2);
    a *= (-2);
    assert(a == Fraction(5, 1));

    a = Fraction(0, 1);
    a /= 5;
    assert(a == Fraction(0, 1));

    a = Fraction(-5, 2);
    a /= 2;
    assert(a == Fraction(-5, 4));
  }
}